

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvrp-instance-modifier.c
# Opt level: O3

Instance * process_instance(Instance *__return_storage_ptr__,Instance *instance,AppCtx *ctx)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  instance_copy(__return_storage_ptr__,instance,true,true);
  dVar3 = ctx->cap_scale_factor;
  if ((dVar3 != 1.0) || (NAN(dVar3))) {
    __return_storage_ptr__->vehicle_cap = __return_storage_ptr__->vehicle_cap * dVar3;
    dVar3 = ceil((double)__return_storage_ptr__->num_vehicles / dVar3);
    iVar1 = (int)dVar3;
  }
  else {
    iVar1 = __return_storage_ptr__->num_vehicles;
  }
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  __return_storage_ptr__->num_vehicles = iVar2;
  return __return_storage_ptr__;
}

Assistant:

Instance process_instance(const Instance *instance, const AppCtx *ctx) {
    Instance result = instance_copy(instance, true, true);

    if (ctx->cap_scale_factor != 1.0) {
        result.vehicle_cap = result.vehicle_cap * ctx->cap_scale_factor;
        result.num_vehicles = (int32_t)(ceil((double)result.num_vehicles /
                                             ctx->cap_scale_factor));
    }

    result.num_vehicles = MAX(1, result.num_vehicles);
    return result;
}